

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::SFML::Update(Vector2i *mousePos,Vector2f *displaySize,Time dt)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  ImGuiIO *pIVar5;
  uint i;
  long lVar6;
  float fVar7;
  float fVar8;
  Vector2i newMousePos;
  Time local_30;
  Vector2i local_28;
  
  local_30.m_microseconds = dt.m_microseconds;
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx && \"No current window is set - forgot to call ImGui::SFML::Init?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x1c3,
                  "void ImGui::SFML::Update(const sf::Vector2i &, const sf::Vector2f &, sf::Time)");
  }
  pIVar5 = GetIO();
  fVar7 = displaySize->y;
  (pIVar5->DisplaySize).x = displaySize->x;
  (pIVar5->DisplaySize).y = fVar7;
  fVar7 = sf::Time::asSeconds(&local_30);
  pIVar5->DeltaTime = fVar7;
  if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x38) == '\x01') {
    if (pIVar5->WantSetMousePos == true) {
      local_28.x = (int)(pIVar5->MousePos).x;
      local_28.y = (int)(pIVar5->MousePos).y;
      sf::Mouse::setPosition(&local_28);
    }
    else {
      iVar1 = mousePos->y;
      (pIVar5->MousePos).x = (float)mousePos->x;
      (pIVar5->MousePos).y = (float)iVar1;
    }
    lVar6 = 0;
    do {
      bVar4 = true;
      if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x44 + lVar6) == '\0') {
        bVar3 = sf::Touch::isDown((Button)lVar6);
        if ((!bVar3) && (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x3a + lVar6) == '\0'))
        {
          bVar4 = sf::Mouse::isButtonPressed((Button)lVar6);
        }
      }
      pIVar5->MouseDown[lVar6] = bVar4;
      lVar2 = (anonymous_namespace)::s_currWindowCtx;
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x3a + lVar6) = 0;
      *(undefined1 *)(lVar2 + 0x44 + lVar6) = 0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  if ((pIVar5->Fonts->Fonts).Size < 1) {
    __assert_fail("io.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x1e8,
                  "void ImGui::SFML::Update(const sf::Vector2i &, const sf::Vector2f &, sf::Time)");
  }
  if (((pIVar5->ConfigFlags & 2) != 0) &&
     (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) != 8)) {
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x54));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[0] = fVar7;
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x58));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[1] = fVar7;
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x5c));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[2] = fVar7;
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x60));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[3] = fVar7;
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x84));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[0xc] = fVar7;
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x88));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[0xd] = fVar7;
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x8c));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[0xe] = fVar7;
    bVar4 = sf::Joystick::isButtonPressed
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x90));
    fVar7 = 1.0;
    if (!bVar4) {
      fVar7 = 0.0;
    }
    pIVar5->NavInputs[0xf] = fVar7;
    fVar7 = sf::Joystick::getAxisPosition
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(Axis *)((anonymous_namespace)::s_currWindowCtx + 0xa4));
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xac) != '\0') {
      fVar7 = -fVar7;
    }
    fVar8 = sf::Joystick::getAxisPosition
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(Axis *)((anonymous_namespace)::s_currWindowCtx + 0xa8));
    lVar6 = (anonymous_namespace)::s_currWindowCtx;
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xad) != '\0') {
      fVar8 = -fVar8;
    }
    pIVar5->NavInputs[4] =
         (float)(-(uint)(fVar7 < -*(float *)((anonymous_namespace)::s_currWindowCtx + 0xb0)) &
                0x3f800000);
    pIVar5->NavInputs[5] = (float)(-(uint)(*(float *)(lVar6 + 0xb0) < fVar7) & 0x3f800000);
    pIVar5->NavInputs[6] = (float)(-(uint)(fVar8 < -*(float *)(lVar6 + 0xb0)) & 0x3f800000);
    pIVar5->NavInputs[7] = (float)(-(uint)(*(float *)(lVar6 + 0xb0) < fVar8) & 0x3f800000);
    fVar7 = sf::Joystick::getAxisPosition(*(uint *)(lVar6 + 0x50),*(Axis *)(lVar6 + 0xb4));
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xbc) != '\0') {
      fVar7 = -fVar7;
    }
    fVar8 = sf::Joystick::getAxisPosition
                      (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50),
                       *(Axis *)((anonymous_namespace)::s_currWindowCtx + 0xb8));
    lVar6 = (anonymous_namespace)::s_currWindowCtx;
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0xbd) != '\0') {
      fVar8 = -fVar8;
    }
    if (fVar7 < -*(float *)((anonymous_namespace)::s_currWindowCtx + 0xc0)) {
      pIVar5->NavInputs[8] = ABS(fVar7 / 100.0);
    }
    if (*(float *)(lVar6 + 0xc0) <= fVar7 && fVar7 != *(float *)(lVar6 + 0xc0)) {
      pIVar5->NavInputs[9] = fVar7 / 100.0;
    }
    if (fVar8 < -*(float *)(lVar6 + 0xc0)) {
      pIVar5->NavInputs[10] = ABS(fVar8 / 100.0);
    }
    if (*(float *)(lVar6 + 0xc0) <= fVar8 && fVar8 != *(float *)(lVar6 + 0xc0)) {
      pIVar5->NavInputs[0xb] = fVar8 / 100.0;
    }
  }
  NewFrame();
  return;
}

Assistant:

void Update(const sf::Vector2i& mousePos, const sf::Vector2f& displaySize, sf::Time dt) {
    assert(s_currWindowCtx && "No current window is set - forgot to call ImGui::SFML::Init?");

    ImGuiIO& io = ImGui::GetIO();
    io.DisplaySize = ImVec2(displaySize.x, displaySize.y);
    io.DeltaTime = dt.asSeconds();

    if (s_currWindowCtx->windowHasFocus) {
        if (io.WantSetMousePos) {
            sf::Vector2i newMousePos(static_cast<int>(io.MousePos.x),
                                     static_cast<int>(io.MousePos.y));
            sf::Mouse::setPosition(newMousePos);
        } else {
            io.MousePos = ImVec2(static_cast<float>(mousePos.x), static_cast<float>(mousePos.y));
        }
        for (unsigned int i = 0; i < 3; i++) {
            io.MouseDown[i] = s_currWindowCtx->touchDown[i] || sf::Touch::isDown(i) ||
                              s_currWindowCtx->mousePressed[i] ||
                              sf::Mouse::isButtonPressed((sf::Mouse::Button)i);
            s_currWindowCtx->mousePressed[i] = false;
            s_currWindowCtx->touchDown[i] = false;
        }
    }

#ifdef ANDROID
#ifdef USE_JNI
    if (io.WantTextInput && !s_currWindowCtx->wantTextInput) {
        openKeyboardIME();
        s_currWindowCtx->wantTextInput = true;
    }

    if (!io.WantTextInput && s_currWindowCtx->wantTextInput) {
        closeKeyboardIME();
        s_currWindowCtx->wantTextInput = false;
    }
#endif
#endif

    assert(io.Fonts->Fonts.Size > 0); // You forgot to create and set up font
                                      // atlas (see createFontTexture)

    // gamepad navigation
    if ((io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) &&
        s_currWindowCtx->joystickId != NULL_JOYSTICK_ID) {
        updateJoystickActionState(io, ImGuiNavInput_Activate);
        updateJoystickActionState(io, ImGuiNavInput_Cancel);
        updateJoystickActionState(io, ImGuiNavInput_Input);
        updateJoystickActionState(io, ImGuiNavInput_Menu);

        updateJoystickActionState(io, ImGuiNavInput_FocusPrev);
        updateJoystickActionState(io, ImGuiNavInput_FocusNext);

        updateJoystickActionState(io, ImGuiNavInput_TweakSlow);
        updateJoystickActionState(io, ImGuiNavInput_TweakFast);

        updateJoystickDPadState(io);
        updateJoystickLStickState(io);
    }

    ImGui::NewFrame();
}